

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Performance::anon_unknown_1::FunctionCase::setGeneralUniforms
          (FunctionCase *this,deUint32 program)

{
  DataType dataType;
  glUniform1fFunc p_Var1;
  glGetUniformLocationFunc p_Var2;
  int i;
  int iVar3;
  GLint GVar4;
  int iVar5;
  undefined4 extraout_var;
  long lVar6;
  int i_3;
  Functions *in_R8;
  long lVar7;
  float fVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  float values [4];
  Functions *gl;
  
  iVar3 = (*((this->super_OperatorPerformanceCase).m_renderCtx)->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar3);
  p_Var1 = gl->uniform1f;
  GVar4 = (*gl->getUniformLocation)(program,"u_zero");
  (*p_Var1)(GVar4,0.0);
  iVar3 = 0;
  lVar7 = 0;
  do {
    if (lVar7 == 3) {
      return;
    }
    dataType = this->m_paramTypes[lVar7];
    if (dataType != TYPE_INVALID) {
      iVar5 = glu::getDataTypeScalarSize(dataType);
      p_Var2 = gl->getUniformLocation;
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_local_buf[0] = '\0';
      std::operator+(&local_98,&local_b8,"u_inc");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)values,
                     &local_98,(char)lVar7 + 'A');
      GVar4 = (*p_Var2)(program,(GLchar *)values._0_8_);
      std::__cxx11::string::~string((string *)values);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      fVar8 = (float)(int)(uint)lVar7;
      if (dataType < TYPE_FLOAT_MAT2) {
        for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
          values[lVar6] = fVar8 * 0.01 + (float)(int)lVar6 * 0.001;
        }
        if (iVar5 - 1U < 4) {
          (*(&gl->uniform1fv)[(ulong)(iVar5 - 1U) * 8])(GVar4,1,values);
        }
      }
      else {
        if (dataType - TYPE_INT < 4) {
          for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
            values[lVar6] = (float)((int)lVar6 + iVar3);
          }
        }
        else {
          if (3 < dataType - TYPE_BOOL) {
            if (dataType - TYPE_FLOAT_MAT2 < 9 || dataType - TYPE_DOUBLE_MAT2 < 9) {
              iVar5 = glu::getDataTypeMatrixNumRows(dataType);
              for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
                values[lVar6] = fVar8 * 0.01 + (float)(int)lVar6 * 0.001;
              }
              if (iVar5 - 2U < 3) {
                in_R8 = gl;
                (*(&gl->uniformMatrix2fv)[(ulong)(iVar5 - 2U) * 6])(GVar4,1,'\0',values);
              }
            }
            goto LAB_007175aa;
          }
          for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
            values[lVar6] = (float)(uint)(((uint)lVar7 >> ((uint)lVar6 & 0x1f) & 1) != 0);
          }
        }
        uniformNiv(gl,iVar5,GVar4,(int)values,(int *)in_R8);
      }
    }
LAB_007175aa:
    lVar7 = lVar7 + 1;
    iVar3 = iVar3 + 100;
  } while( true );
}

Assistant:

void FunctionCase::setGeneralUniforms (deUint32 program) const
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	gl.uniform1f(gl.getUniformLocation(program, "u_zero"), 0.0f);

	for (int paramNdx = 0; paramNdx < MAX_PARAMS; paramNdx++)
	{
		if (m_paramTypes[paramNdx] != glu::TYPE_INVALID)
		{
			const glu::DataType		paramType	= m_paramTypes[paramNdx];
			const int				scalarSize	= glu::getDataTypeScalarSize(paramType);
			const int				location	= gl.getUniformLocation(program, (string() + "u_inc" + (char)('A'+paramNdx)).c_str());

			if (glu::isDataTypeFloatOrVec(paramType))
			{
				float values[4];
				for (int i = 0; i < DE_LENGTH_OF_ARRAY(values); i++)
					values[i] = (float)paramNdx*0.01f + (float)i*0.001f; // Arbitrary small values.
				uniformNfv(gl, scalarSize, location, 1, &values[0]);
			}
			else if (glu::isDataTypeIntOrIVec(paramType))
			{
				int values[4];
				for (int i = 0; i < DE_LENGTH_OF_ARRAY(values); i++)
					values[i] = paramNdx*100 + i; // Arbitrary values.
				uniformNiv(gl, scalarSize, location, 1, &values[0]);
			}
			else if (glu::isDataTypeBoolOrBVec(paramType))
			{
				int values[4];
				for (int i = 0; i < DE_LENGTH_OF_ARRAY(values); i++)
					values[i] = (paramNdx >> i) & 1; // Arbitrary values.
				uniformNiv(gl, scalarSize, location, 1, &values[0]);
			}
			else if (glu::isDataTypeMatrix(paramType))
			{
				const int size = glu::getDataTypeMatrixNumRows(paramType);
				DE_ASSERT(size == glu::getDataTypeMatrixNumColumns(paramType));
				float values[4*4];
				for (int i = 0; i < DE_LENGTH_OF_ARRAY(values); i++)
					values[i] = (float)paramNdx*0.01f + (float)i*0.001f; // Arbitrary values.
				uniformMatrixNfv(gl, size, location, 1, &values[0]);
			}
			else
				DE_ASSERT(false);
		}
	}
}